

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

Type * soul::Type::createVector(Type *__return_storage_ptr__,PrimitiveType *element,ArraySize size)

{
  Primitive PVar1;
  
  PVar1 = element->type;
  if (((bool_ < PVar1) || ((0x39cU >> (PVar1 & 0x1f) & 1) == 0)) && (1 < PVar1 - complex32)) {
    throwInternalCompilerError("element.canBeVectorElementType()","createVector",0xed);
  }
  if (0xff < size - 1) {
    throwInternalCompilerError("isLegalVectorSize ((int64_t) size)","createVector",0xee);
  }
  if (PVar1 != invalid) {
    __return_storage_ptr__->category = vector;
    *(undefined8 *)&__return_storage_ptr__->arrayElementCategory = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->boundingSize + 1) = 0;
    (__return_storage_ptr__->structure).object = (Structure *)0x0;
    (__return_storage_ptr__->primitiveType).type = PVar1;
    __return_storage_ptr__->boundingSize = (BoundedIntSize)size;
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("prim.isValid()","createSizedType",0x149);
}

Assistant:

Type Type::createVector (PrimitiveType element, ArraySize size)
{
    SOUL_ASSERT (element.canBeVectorElementType());
    SOUL_ASSERT (isLegalVectorSize ((int64_t) size));
    return createSizedType (element, Category::vector, size);
}